

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

void ImGui::TabBarScrollToTab(ImGuiTabBar *tab_bar,ImGuiTabItem *tab,ImGuiTabBarSection *sections)

{
  int iVar1;
  float fVar2;
  int *in_RDX;
  long in_RSI;
  int *in_RDI;
  float fVar3;
  float fVar4;
  float tab_x2;
  float tab_x1;
  float scrollable_width;
  int order;
  float margin;
  ImGuiContext *g;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  
  if ((*(uint *)(in_RSI + 4) & 0xc0) == 0) {
    fVar4 = GImGui->FontSize * 1.0;
    iVar1 = ImGuiTabBar::GetTabOrder
                      ((ImGuiTabBar *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                       (ImGuiTabItem *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8)
                      );
    fVar3 = ImRect::GetWidth((ImRect *)(in_RDI + 0xb));
    fVar3 = ((fVar3 - (float)in_RDX[1]) - (float)in_RDX[7]) - (float)in_RDX[5];
    if (*in_RDX + -1 < iVar1) {
      fVar2 = -fVar4;
    }
    else {
      fVar2 = 0.0;
    }
    fVar2 = (*(float *)(in_RSI + 0x10) - (float)in_RDX[1]) + fVar2;
    if (*in_RDI - in_RDX[6] <= iVar1 + 1) {
      fVar4 = 1.0;
    }
    fVar4 = (*(float *)(in_RSI + 0x10) - (float)in_RDX[1]) + *(float *)(in_RSI + 0x14) + fVar4;
    in_RDI[0x15] = 0;
    if ((fVar2 < (float)in_RDI[0x14]) || (fVar3 <= fVar4 - fVar2)) {
      fVar4 = ImMax<float>((float)in_RDI[0x13] - fVar4,0.0);
      in_RDI[0x15] = (int)fVar4;
      in_RDI[0x14] = (int)fVar2;
    }
    else if ((float)in_RDI[0x14] < fVar4 - fVar3) {
      fVar2 = ImMax<float>((fVar2 - fVar3) - (float)in_RDI[0x13],0.0);
      in_RDI[0x15] = (int)fVar2;
      in_RDI[0x14] = (int)(fVar4 - fVar3);
    }
  }
  return;
}

Assistant:

static void ImGui::TabBarScrollToTab(ImGuiTabBar* tab_bar, ImGuiTabItem* tab, ImGuiTabBarSection* sections)
{
    if (tab->Flags & (ImGuiTabItemFlags_Leading | ImGuiTabItemFlags_Trailing))
        return;

    ImGuiContext& g = *GImGui;
    float margin = g.FontSize * 1.0f; // When to scroll to make Tab N+1 visible always make a bit of N visible to suggest more scrolling area (since we don't have a scrollbar)
    int order = tab_bar->GetTabOrder(tab);

    // Scrolling happens only in the central section (leading/trailing sections are not scrolling)
    // FIXME: This is all confusing.
    float scrollable_width = tab_bar->BarRect.GetWidth() - sections[0].Width - sections[2].Width - sections[1].Spacing;

    // We make all tabs positions all relative Sections[0].Width to make code simpler
    float tab_x1 = tab->Offset - sections[0].Width + (order > sections[0].TabCount - 1 ? -margin : 0.0f);
    float tab_x2 = tab->Offset - sections[0].Width + tab->Width + (order + 1 < tab_bar->Tabs.Size - sections[2].TabCount ? margin : 1.0f);
    tab_bar->ScrollingTargetDistToVisibility = 0.0f;
    if (tab_bar->ScrollingTarget > tab_x1 || (tab_x2 - tab_x1 >= scrollable_width))
    {
        // Scroll to the left
        tab_bar->ScrollingTargetDistToVisibility = ImMax(tab_bar->ScrollingAnim - tab_x2, 0.0f);
        tab_bar->ScrollingTarget = tab_x1;
    }
    else if (tab_bar->ScrollingTarget < tab_x2 - scrollable_width)
    {
        // Scroll to the right
        tab_bar->ScrollingTargetDistToVisibility = ImMax((tab_x1 - scrollable_width) - tab_bar->ScrollingAnim, 0.0f);
        tab_bar->ScrollingTarget = tab_x2 - scrollable_width;
    }
}